

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImPool<ImGuiTable>::Remove(ImPool<ImGuiTable> *this,ImGuiID key,ImPoolIdx idx)

{
  ImGuiTable::~ImGuiTable((this->Buf).Data + idx);
  (this->Buf).Data[idx].ID = this->FreeIdx;
  this->FreeIdx = idx;
  ImGuiStorage::SetInt(&this->Map,key,-1);
  return;
}

Assistant:

void        Remove(ImGuiID key, ImPoolIdx idx)  { Buf[idx].~T(); *(int*)&Buf[idx] = FreeIdx; FreeIdx = idx; Map.SetInt(key, -1); }